

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

uint __thiscall QXmlStreamReaderPrivate::getChar_helper(QXmlStreamReaderPrivate *this)

{
  QByteArrayView ba;
  bool bVar1;
  char16_t cVar2;
  qsizetype qVar3;
  char *pcVar4;
  longlong *plVar5;
  size_t in_RCX;
  long in_RDI;
  long in_FS_OFFSET;
  ushort c;
  qsizetype BUFFER_SIZE;
  qint64 nbytesreadOrMinus1;
  optional<QStringConverter::Encoding> encoding;
  undefined4 in_stack_fffffffffffffeb8;
  Flag in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 uVar6;
  QFlagsStorage<QStringConverterBase::Flag> in_stack_fffffffffffffecc;
  undefined4 uVar7;
  QByteArrayView *in_stack_fffffffffffffed0;
  QIODevice *in_stack_fffffffffffffee8;
  char16_t in_stack_ffffffffffffff06;
  uint local_d8;
  QChar local_d2 [17];
  QByteArrayView in_stack_ffffffffffffff50;
  longlong local_60;
  ssize_t local_58;
  _Optional_payload_base<QStringConverter::Encoding> local_50;
  _Optional_payload_base<QStringConverter::Encoding> local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(long *)(in_RDI + 0x1b0) = *(long *)(in_RDI + 0xc0) + *(long *)(in_RDI + 0x1b0);
  *(undefined8 *)(in_RDI + 0xc0) = 0;
  qVar3 = QString::size((QString *)(in_RDI + 0xa8));
  if (qVar3 != 0) {
    QString::resize((QString *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  bVar1 = QStringConverter::isValid((QStringConverter *)(in_RDI + 0x120));
  if (bVar1) {
    *(undefined8 *)(in_RDI + 0xa0) = 0;
  }
  if (*(long *)(in_RDI + 0x110) == 0) {
    if (*(long *)(in_RDI + 0xa0) == 0) {
      QByteArray::operator=
                ((QByteArray *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
    else {
      QByteArray::operator+=
                ((QByteArray *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
    qVar3 = QByteArray::size((QByteArray *)(in_RDI + 0x68));
    *(qsizetype *)(in_RDI + 0xa0) = qVar3;
    QByteArray::clear((QByteArray *)0x648f12);
  }
  else {
    QByteArray::resize((QByteArray *)in_stack_fffffffffffffed0,
                       CONCAT44(in_stack_fffffffffffffecc.i,in_stack_fffffffffffffec8));
    in_stack_fffffffffffffee8 = *(QIODevice **)(in_RDI + 0x110);
    pcVar4 = QByteArray::data((QByteArray *)
                              CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    local_58 = QIODevice::read(in_stack_fffffffffffffee8,
                               (int)pcVar4 + (int)*(undefined8 *)(in_RDI + 0xa0),
                               (void *)(0x2000 - *(long *)(in_RDI + 0xa0)),in_RCX);
    local_60 = 0;
    plVar5 = qMax<long_long>(&local_58,&local_60);
    *(longlong *)(in_RDI + 0xa0) = *plVar5 + *(long *)(in_RDI + 0xa0);
  }
  if (*(long *)(in_RDI + 0xa0) == 0) {
    *(undefined1 *)(in_RDI + 0x158) = 1;
    local_d8 = 0xffffffff;
  }
  else {
    bVar1 = QStringConverter::isValid((QStringConverter *)(in_RDI + 0x120));
    if (!bVar1) {
      if (*(long *)(in_RDI + 0xa0) < 4) {
        *(undefined1 *)(in_RDI + 0x158) = 1;
        local_d8 = 0xffffffff;
        goto LAB_0064924d;
      }
      local_48 = (_Optional_payload_base<QStringConverter::Encoding>)&DAT_aaaaaaaaaaaaaaaa;
      QByteArrayView::QByteArrayView<QByteArray,_true>
                (in_stack_fffffffffffffed0,
                 (QByteArray *)CONCAT44(in_stack_fffffffffffffecc.i,in_stack_fffffffffffffec8));
      local_48 = (_Optional_payload_base<QStringConverter::Encoding>)
                 QStringConverter::encodingForData
                           (in_stack_ffffffffffffff50,in_stack_ffffffffffffff06);
      bVar1 = std::optional::operator_cast_to_bool((optional<QStringConverter::Encoding> *)0x648fcf)
      ;
      if (!bVar1) {
        std::optional<QStringConverter::Encoding>::optional<QStringConverter::Encoding,_true>
                  ((optional<QStringConverter::Encoding> *)
                   CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                   (Encoding *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        local_48 = local_50;
      }
      std::optional<QStringConverter::Encoding>::operator*
                ((optional<QStringConverter::Encoding> *)0x649010);
      QFlags<QStringConverterBase::Flag>::QFlags
                ((QFlags<QStringConverterBase::Flag> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffebc);
      QStringDecoder::QStringDecoder
                ((QStringDecoder *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffebc,(Flags)in_stack_fffffffffffffecc.i);
      QStringDecoder::operator=
                ((QStringDecoder *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (QStringDecoder *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      QStringDecoder::~QStringDecoder((QStringDecoder *)0x649063);
    }
    QByteArrayView::QByteArrayView<QByteArray,_true>
              (in_stack_fffffffffffffed0,
               (QByteArray *)CONCAT44(in_stack_fffffffffffffecc.i,in_stack_fffffffffffffec8));
    QByteArrayView::first
              ((QByteArrayView *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               0x6490a0);
    ba.m_size._4_4_ = in_stack_fffffffffffffec4;
    ba.m_size._0_4_ = in_stack_fffffffffffffec0;
    ba.m_data._0_4_ = in_stack_fffffffffffffec8;
    ba.m_data._4_4_ = in_stack_fffffffffffffecc.i;
    QStringDecoder::operator()
              ((QStringDecoder *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),ba);
    QStringDecoder::EncodedData::operator_cast_to_QString
              ((EncodedData<QByteArrayView> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       (QString *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    QString::~QString((QString *)0x649101);
    if (((*(ushort *)(in_RDI + 0x3a8) >> 0xb & 1) == 0) ||
       (bVar1 = QStringConverter::hasError((QStringConverter *)(in_RDI + 0x120)), !bVar1)) {
      QString::reserve((QString *)in_stack_fffffffffffffed0,(qsizetype)in_stack_fffffffffffffee8);
      uVar6 = (undefined4)*(undefined8 *)(in_RDI + 0xc0);
      uVar7 = (undefined4)((ulong)*(undefined8 *)(in_RDI + 0xc0) >> 0x20);
      qVar3 = QString::size((QString *)(in_RDI + 0xa8));
      if (CONCAT44(uVar7,uVar6) < qVar3) {
        *(long *)(in_RDI + 0xc0) = *(long *)(in_RDI + 0xc0) + 1;
        local_d2[0] = QString::at((QString *)CONCAT44(uVar7,uVar6),
                                  CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        cVar2 = QChar::unicode(local_d2);
        local_d8 = (uint)(ushort)cVar2;
      }
      else {
        *(undefined1 *)(in_RDI + 0x158) = 1;
        local_d8 = 0xffffffff;
      }
    }
    else {
      QXmlStream::tr((char *)CONCAT44(in_stack_fffffffffffffecc.i,in_stack_fffffffffffffec8),
                     (char *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffebc);
      raiseWellFormedError
                ((QXmlStreamReaderPrivate *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (QString *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      QString::~QString((QString *)0x649172);
      QString::clear((QString *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      local_d8 = 0xffffffff;
    }
  }
LAB_0064924d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_d8;
}

Assistant:

uint QXmlStreamReaderPrivate::getChar_helper()
{
    constexpr qsizetype BUFFER_SIZE = 8192;
    characterOffset += readBufferPos;
    readBufferPos = 0;
    if (readBuffer.size())
        readBuffer.resize(0);
    if (decoder.isValid())
        nbytesread = 0;
    if (device) {
        rawReadBuffer.resize(BUFFER_SIZE);
        qint64 nbytesreadOrMinus1 = device->read(rawReadBuffer.data() + nbytesread, BUFFER_SIZE - nbytesread);
        nbytesread += qMax(nbytesreadOrMinus1, qint64{0});
    } else {
        if (nbytesread)
            rawReadBuffer += dataBuffer;
        else
            rawReadBuffer = dataBuffer;
        nbytesread = rawReadBuffer.size();
        dataBuffer.clear();
    }
    if (!nbytesread) {
        atEnd = true;
        return StreamEOF;
    }

    if (!decoder.isValid()) {
        if (nbytesread < 4) { // the 4 is to cover 0xef 0xbb 0xbf plus
                              // one extra for the utf8 codec
            atEnd = true;
            return StreamEOF;
        }
        auto encoding = QStringDecoder::encodingForData(rawReadBuffer, char16_t('<'));
        if (!encoding)
            // assume utf-8
            encoding = QStringDecoder::Utf8;
        decoder = QStringDecoder(*encoding);
    }

    readBuffer = decoder(QByteArrayView(rawReadBuffer).first(nbytesread));

    if (lockEncoding && decoder.hasError()) {
        raiseWellFormedError(QXmlStream::tr("Encountered incorrectly encoded content."));
        readBuffer.clear();
        return StreamEOF;
    }

    readBuffer.reserve(1); // keep capacity when calling resize() next time

    if (readBufferPos < readBuffer.size()) {
        ushort c = readBuffer.at(readBufferPos++).unicode();
        return c;
    }

    atEnd = true;
    return StreamEOF;
}